

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaD_poscall(lua_State *L,StkId firstResult)

{
  int iVar1;
  CallInfo *pCVar2;
  uint uVar3;
  StkId pTVar4;
  StkId pTVar5;
  int iVar6;
  
  pCVar2 = L->ci;
  L->ci = pCVar2 + -1;
  pTVar5 = pCVar2->func;
  iVar1 = pCVar2->nresults;
  L->base = pCVar2[-1].base;
  L->savedpc = pCVar2[-1].savedpc;
  if (iVar1 != 0) {
    iVar6 = 0;
    pTVar4 = pTVar5;
    do {
      if (L->top <= firstResult) {
        pTVar5 = pTVar4;
        if (0 < iVar1 - iVar6) {
          uVar3 = (iVar1 + 1) - iVar6;
          do {
            pTVar4->tt = 0;
            pTVar4 = pTVar4 + 1;
            uVar3 = uVar3 - 1;
            pTVar5 = pTVar4;
          } while (1 < uVar3);
        }
        break;
      }
      pTVar5 = pTVar4 + 1;
      pTVar4->value = firstResult->value;
      pTVar4->tt = firstResult->tt;
      iVar6 = iVar6 + 1;
      firstResult = firstResult + 1;
      pTVar4 = pTVar5;
    } while (iVar1 != iVar6);
  }
  L->top = pTVar5;
  return iVar1 + 1;
}

Assistant:

static int luaD_poscall(lua_State*L,StkId firstResult){
StkId res;
int wanted,i;
CallInfo*ci;
ci=L->ci--;
res=ci->func;
wanted=ci->nresults;
L->base=(ci-1)->base;
L->savedpc=(ci-1)->savedpc;
for(i=wanted;i!=0&&firstResult<L->top;i--)
setobj(L,res++,firstResult++);
while(i-->0)
setnilvalue(res++);
L->top=res;
return(wanted-(-1));
}